

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode,
          bool testOkToFail)

{
  XmlWriter *this_00;
  pointer psVar1;
  _anonymous_namespace_ *this_01;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *childNode;
  pointer psVar2;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [24];
  string name;
  ScopedElement e;
  
  local_78._16_8_ = this;
  trim(&name,&(sectionNode->stats).sectionInfo.name);
  if (rootName->_M_string_length != 0) {
    std::operator+(&local_98,rootName,'/');
    std::operator+(&local_c0,&local_98,&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((((sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_finish) || ((sectionNode->stdOut)._M_string_length != 0)) ||
     ((sectionNode->stdErr)._M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"testcase",(allocator<char> *)&local_98);
    this_00 = (XmlWriter *)(local_78._16_8_ + 0xd8);
    XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_00,(XmlFormatting)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (className->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"classname",(allocator<char> *)&local_98);
      XmlWriter::writeAttribute(this_00,&local_c0,&name);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"name",(allocator<char> *)&local_98);
      XmlWriter::writeAttribute<char[5]>(this_00,&local_c0,(char (*) [5])"root");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"classname",(allocator<char> *)&local_98);
      XmlWriter::writeAttribute(this_00,&local_c0,className);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"name",(allocator<char> *)&local_98);
      XmlWriter::writeAttribute(this_00,&local_c0,&name);
    }
    std::__cxx11::string::~string((string *)&local_c0);
    this_01 = (_anonymous_namespace_ *)0x155e8f;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"time",(allocator<char> *)local_78);
    (anonymous_namespace)::formatDuration_abi_cxx11_
              (&local_98,this_01,(sectionNode->stats).durationInSeconds);
    XmlWriter::writeAttribute(this_00,&local_c0,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"status",(allocator<char> *)&local_98);
    XmlWriter::writeAttribute<char[4]>(this_00,&local_c0,(char (*) [4])0x155b4c);
    std::__cxx11::string::~string((string *)&local_c0);
    if ((sectionNode->stats).assertions.failedButOk != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"skipped",&local_c1);
      XmlWriter::scopedElement((XmlWriter *)local_78,(string *)this_00,(XmlFormatting)&local_c0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"message",&local_99);
      XmlWriter::writeAttribute<char[31]>
                ((XmlWriter *)local_78._0_8_,&local_98,
                 (char (*) [31])"TEST_CASE tagged with !mayfail");
      std::__cxx11::string::~string((string *)&local_98);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_78);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    writeAssertions((JunitReporter *)local_78._16_8_,sectionNode);
    if ((sectionNode->stdOut)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"system-out",&local_c1)
      ;
      XmlWriter::scopedElement((XmlWriter *)local_78,(string *)this_00,(XmlFormatting)&local_c0);
      trim(&local_98,&sectionNode->stdOut);
      XmlWriter::writeText((XmlWriter *)local_78._0_8_,&local_98,Newline);
      std::__cxx11::string::~string((string *)&local_98);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_78);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    if ((sectionNode->stdErr)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"system-err",&local_c1)
      ;
      XmlWriter::scopedElement((XmlWriter *)local_78,(string *)this_00,(XmlFormatting)&local_c0);
      trim(&local_98,&sectionNode->stdErr);
      XmlWriter::writeText((XmlWriter *)local_78._0_8_,&local_98,Newline);
      std::__cxx11::string::~string((string *)&local_98);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_78);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    XmlWriter::ScopedElement::~ScopedElement(&e);
  }
  psVar1 = (sectionNode->childSections).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (sectionNode->childSections).
                super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    if (className->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"",(allocator<char> *)&local_98);
      writeSection((JunitReporter *)local_78._16_8_,&name,&local_c0,
                   (psVar2->
                   super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr,testOkToFail);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    else {
      writeSection((JunitReporter *)local_78._16_8_,className,&name,
                   (psVar2->
                   super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr,testOkToFail);
    }
  }
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void JunitReporter::writeSection( std::string const& className,
                                      std::string const& rootName,
                                      SectionNode const& sectionNode,
                                      bool testOkToFail) {
        std::string name = trim( sectionNode.stats.sectionInfo.name );
        if( !rootName.empty() )
            name = rootName + '/' + name;

        if( !sectionNode.assertions.empty() ||
            !sectionNode.stdOut.empty() ||
            !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
            if( className.empty() ) {
                xml.writeAttribute( "classname", name );
                xml.writeAttribute( "name", "root" );
            }
            else {
                xml.writeAttribute( "classname", className );
                xml.writeAttribute( "name", name );
            }
            xml.writeAttribute( "time", formatDuration( sectionNode.stats.durationInSeconds ) );
            // This is not ideal, but it should be enough to mimic gtest's
            // junit output.
            // Ideally the JUnit reporter would also handle `skipTest`
            // events and write those out appropriately.
            xml.writeAttribute( "status", "run" );

            if (sectionNode.stats.assertions.failedButOk) {
                xml.scopedElement("skipped")
                    .writeAttribute("message", "TEST_CASE tagged with !mayfail");
            }

            writeAssertions( sectionNode );

            if( !sectionNode.stdOut.empty() )
                xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), XmlFormatting::Newline );
            if( !sectionNode.stdErr.empty() )
                xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), XmlFormatting::Newline );
        }
        for( auto const& childNode : sectionNode.childSections )
            if( className.empty() )
                writeSection( name, "", *childNode, testOkToFail );
            else
                writeSection( className, name, *childNode, testOkToFail );
    }